

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O0

GameResult __thiscall Game::getGuess(Game *this)

{
  int iVar1;
  reference pvVar2;
  int local_40;
  int local_3c;
  int j;
  int i;
  int cows;
  int bulls;
  vector<int,_std::allocator<int>_> guessedNumbers;
  Game *this_local;
  
  guessedNumbers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &this->guessCount;
  getGuessedNumbers((vector<int,_std::allocator<int>_> *)&cows,this);
  i = 0;
  j = 0;
  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&cows,(long)local_3c);
    iVar1 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->referenceNumbers,(long)local_3c);
    if (iVar1 == *pvVar2) {
      i = i + 1;
    }
    else {
      for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
        if (local_40 != local_3c) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->referenceNumbers,(long)local_3c);
          iVar1 = *pvVar2;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&cows,(long)local_40);
          if (iVar1 == *pvVar2) {
            j = j + 1;
          }
        }
      }
    }
  }
  GameResult::GameResult((GameResult *)&this_local,i,j);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&cows);
  return (GameResult)this_local;
}

Assistant:

GameResult Game::getGuess()
{
	auto guessedNumbers = getGuessedNumbers();
	auto bulls = 0;
	auto cows = 0;
	for (auto i = 0; i < length; ++i)
	{
		if (guessedNumbers[i] == referenceNumbers[i])
			++bulls;
		else
		{
			for (auto j = 0; j < length; ++j)
			{
				if (j == i)
					continue;
				else if (referenceNumbers[i] == guessedNumbers[j])
					++cows;
			}
		}
	}

	return GameResult(bulls, cows);
}